

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O0

void __thiscall Wasm::WasmSignature::FinalizeSignature(WasmSignature *this)

{
  uint16 lhs;
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  ArgSlot rhs;
  uint32 uVar5;
  undefined4 *puVar6;
  WasmCompilationException *this_00;
  WasmType **ppWVar7;
  Local local_4c;
  ushort local_3a;
  ArgSlot i_1;
  uint32 nAvailableBits;
  uint32 bitsRequiredForSig;
  undefined4 uStack_28;
  RecordOverflowPolicy sigOverflow;
  uint32 nBitsForArgs;
  uint32 nBitsForResult;
  ushort local_18;
  ArgSlot i;
  ArgSlot paramCount;
  Local resultType;
  WasmSignature *this_local;
  
  uVar5 = GetResultCount(this);
  if (uVar5 < 2) {
    uVar5 = GetResultCount(this);
    if (uVar5 == 1) {
      local_4c = GetResult(this,0);
    }
    else {
      local_4c = Void;
    }
    if (this->m_paramSize != 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                         ,0xab,"(m_paramSize == Js::Constants::InvalidArgSlot)",
                         "m_paramSize == Js::Constants::InvalidArgSlot");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (this->m_shortSig != 0xffffffffffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                         ,0xac,"(m_shortSig == Js::Constants::InvalidSignature)",
                         "m_shortSig == Js::Constants::InvalidSignature");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    AVar4 = GetParamCount(this);
    this->m_paramSize = 0;
    for (local_18 = 0; local_18 < AVar4; local_18 = local_18 + 1) {
      lhs = this->m_paramSize;
      rhs = GetParamSize(this,local_18);
      bVar3 = UInt16Math::Add(lhs,rhs,&this->m_paramSize);
      if (bVar3) {
        this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException(this_00,L"Argument size too big");
        __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                    WasmCompilationException::~WasmCompilationException);
      }
    }
    uStack_28 = 3;
    bitsRequiredForSig = 3;
    Math::RecordOverflowPolicy::RecordOverflowPolicy
              ((RecordOverflowPolicy *)((long)&nAvailableBits + 3));
    uVar5 = UInt32Math::MulAdd<3u,3u,Math::RecordOverflowPolicy>
                      ((uint)AVar4,(RecordOverflowPolicy *)((long)&nAvailableBits + 3));
    bVar3 = Math::RecordOverflowPolicy::HasOverflowed
                      ((RecordOverflowPolicy *)((long)&nAvailableBits + 3));
    if ((!bVar3) && (uVar5 < 0x41)) {
      this->m_shortSig = this->m_shortSig << 3 | (ulong)local_4c;
      for (local_3a = 0; local_3a < AVar4; local_3a = local_3a + 1) {
        TVar1 = this->m_shortSig;
        ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WasmType__
                            ((WriteBarrierPtr *)&this->m_params);
        this->m_shortSig = TVar1 << 3 | (long)(int)((*ppWVar7)[local_3a] - FirstLocalType);
      }
    }
  }
  return;
}

Assistant:

void WasmSignature::FinalizeSignature()
{
    if (GetResultCount() > 1)
    {
        // Do not support short signature with multiple returns at this time
        return;
    }
    Local resultType = GetResultCount() == 1 ? GetResult(0) : WasmTypes::Void;
    Assert(m_paramSize == Js::Constants::InvalidArgSlot);
    Assert(m_shortSig == Js::Constants::InvalidSignature);
    const Js::ArgSlot paramCount = GetParamCount();
    m_paramSize = 0;
    for (Js::ArgSlot i = 0; i < paramCount; ++i)
    {
        if (ArgSlotMath::Add(m_paramSize, GetParamSize(i), &m_paramSize))
        {
            throw WasmCompilationException(_u("Argument size too big"));
        }
    }

    // 3 bits for result type, 3 for each arg
    const uint32 nBitsForResult = 3;
#ifdef ENABLE_WASM_SIMD
    const uint32 nBitsForArgs = 3;
#else
    // We can drop 1 bit by excluding void
    const uint32 nBitsForArgs = 2;
#endif
    CompileAssert(Local::Void == 0);
    // Make sure we can encode all types (including void) with the number of bits reserved
    CompileAssert(Local::Limit <= (1 << nBitsForResult));
    // Make sure we can encode all types (excluding void) with the number of bits reserved
    CompileAssert(Local::Limit - 1 <= (1 << nBitsForArgs));

    ::Math::RecordOverflowPolicy sigOverflow;
    const uint32 bitsRequiredForSig = UInt32Math::MulAdd<nBitsForArgs, nBitsForResult>((uint32)paramCount, sigOverflow);
    if (sigOverflow.HasOverflowed())
    {
        return;
    }

    // we don't need to reserve a sentinel bit because there is no result type with value of 7
    CompileAssert(Local::Limit <= 0b111);
    const uint32 nAvailableBits = sizeof(m_shortSig) * 8;
    if (bitsRequiredForSig <= nAvailableBits)
    {
        // Append the result type to the signature
        m_shortSig = (m_shortSig << nBitsForResult) | resultType;
        for (Js::ArgSlot i = 0; i < paramCount; ++i)
        {
            // Append the param type to the signature, -1 to exclude Void
            m_shortSig = (m_shortSig << nBitsForArgs) | (m_params[i] - 1);
        }
    }
}